

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O2

void do_pick(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  EXIT_DATA *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  OBJ_DATA *arg1;
  ulong uVar6;
  char *txt;
  CHAR_DATA **ppCVar7;
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    txt = "Pick what?\n\r";
    goto LAB_002b37c5;
  }
  WAIT_STATE(ch,(int)skill_table[gsn_pick_lock].beats);
  ppCVar7 = &ch->in_room->people;
  while (ch_00 = *ppCVar7, ch_00 != (CHAR_DATA *)0x0) {
    bVar2 = is_npc(ch_00);
    if (((bVar2) && (bVar2 = is_awake(ch_00), bVar2)) && (ch->level + 5 < (int)ch_00->level)) {
      act("$N is standing too close to the lock.",ch,(void *)0x0,ch_00,3);
      return;
    }
    ppCVar7 = &ch_00->next_in_room;
  }
  bVar2 = is_npc(ch);
  if (!bVar2) {
    iVar3 = number_percent();
    iVar4 = get_skill(ch,(int)gsn_pick_lock);
    if (iVar4 < iVar3) {
      send_to_char("You failed.\n\r",ch);
      bVar2 = false;
      goto LAB_002b3773;
    }
  }
  arg1 = get_obj_here(ch,arg);
  if (arg1 == (OBJ_DATA *)0x0) {
    uVar5 = find_door(ch,arg);
    if ((int)uVar5 < 0) {
      return;
    }
    pEVar1 = ch->in_room->exit[uVar5];
    if (((pEVar1->exit_info[0] & 2) != 0) || (bVar2 = is_immortal(ch), bVar2)) {
      if ((pEVar1->key < 0) && (bVar2 = is_immortal(ch), !bVar2)) {
        txt = "It can\'t be picked.\n\r";
        goto LAB_002b37c5;
      }
      uVar6 = pEVar1->exit_info[0];
      if ((uVar6 & 4) != 0) {
        if ((uVar6 & 8) == 0) {
LAB_002b3852:
          pEVar1->exit_info[0] = uVar6 & 0xfffffffffffffffb;
          send_to_char("*Click*\n\r",ch);
          act("$n picks the $T.",ch,(void *)0x0,pEVar1->keyword,0);
          check_improve(ch,(int)gsn_pick_lock,true,2);
          pEVar1 = ((pEVar1->u1).to_room)->exit[rev_dir[uVar5]];
          if (pEVar1 == (EXIT_DATA *)0x0) {
            return;
          }
          if ((pEVar1->u1).to_room != ch->in_room) {
            return;
          }
          *(byte *)pEVar1->exit_info = (byte)pEVar1->exit_info[0] & 0xfb;
          return;
        }
        bVar2 = is_immortal(ch);
        if (bVar2) {
          uVar6 = pEVar1->exit_info[0];
          goto LAB_002b3852;
        }
LAB_002b39a4:
        txt = "You failed.\n\r";
        goto LAB_002b37c5;
      }
LAB_002b3902:
      txt = "It\'s already unlocked.\n\r";
      goto LAB_002b37c5;
    }
  }
  else if (arg1->item_type == 0xf) {
    uVar5 = arg1->value[1];
    if ((uVar5 & 4) != 0) {
      if (arg1->value[2] < 0) {
LAB_002b393d:
        txt = "It can\'t be unlocked.\n\r";
        goto LAB_002b37c5;
      }
      if ((uVar5 & 8) != 0) {
        if ((uVar5 & 2) != 0) goto LAB_002b39a4;
        uVar5 = uVar5 & 0xfffffff7;
LAB_002b395c:
        arg1->value[1] = uVar5;
        act("You pick the lock on $p.",ch,arg1,(void *)0x0,3);
        act("$n picks the lock on $p.",ch,arg1,(void *)0x0,0);
        bVar2 = true;
LAB_002b3773:
        check_improve(ch,(int)gsn_pick_lock,bVar2,2);
        return;
      }
      goto LAB_002b3902;
    }
  }
  else {
    if (arg1->item_type != 0x1d) {
      txt = "That\'s not a container.\n\r";
      goto LAB_002b37c5;
    }
    uVar5 = arg1->value[1];
    if ((uVar5 & 1) == 0) {
      txt = "You can\'t do that.\n\r";
      goto LAB_002b37c5;
    }
    if ((uVar5 & 2) != 0) {
      if (-1 < arg1->value[4]) {
        if ((uVar5 & 8) != 0) goto LAB_002b39a4;
        uVar5 = uVar5 & 0xfffffffb;
        goto LAB_002b395c;
      }
      goto LAB_002b393d;
    }
  }
  txt = "It\'s not closed.\n\r";
LAB_002b37c5:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_pick(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Pick what?\n\r", ch);
		return;
	}

	WAIT_STATE(ch, skill_table[gsn_pick_lock].beats);

	/* look for guards */
	for (auto gch = ch->in_room->people; gch; gch = gch->next_in_room)
	{
		if (is_npc(gch) && is_awake(gch) && ch->level + 5 < gch->level)
		{
			act("$N is standing too close to the lock.", ch, nullptr, gch, TO_CHAR);
			return;
		}
	}

	if (!is_npc(ch) && number_percent() > get_skill(ch, gsn_pick_lock))
	{
		send_to_char("You failed.\n\r", ch);
		check_improve(ch, gsn_pick_lock, false, 2);
		return;
	}

	auto obj = get_obj_here(ch, arg);
	if (obj != nullptr)
	{
		/* portal stuff */
		if (obj->item_type == ITEM_PORTAL)
		{
			if (!IS_SET_OLD(obj->value[1], EX_ISDOOR))
			{
				send_to_char("You can't do that.\n\r", ch);
				return;
			}

			if (!IS_SET_OLD(obj->value[1], EX_CLOSED))
			{
				send_to_char("It's not closed.\n\r", ch);
				return;
			}

			if (obj->value[4] < 0)
			{
				send_to_char("It can't be unlocked.\n\r", ch);
				return;
			}

			if (IS_SET_OLD(obj->value[1], EX_PICKPROOF))
			{
				send_to_char("You failed.\n\r", ch);
				return;
			}

			REMOVE_BIT_OLD(obj->value[1], EX_LOCKED);

			act("You pick the lock on $p.", ch, obj, nullptr, TO_CHAR);
			act("$n picks the lock on $p.", ch, obj, nullptr, TO_ROOM);
			check_improve(ch, gsn_pick_lock, true, 2);
			return;
		}

		/* 'pick object' */
		if (obj->item_type != ITEM_CONTAINER)
		{
			send_to_char("That's not a container.\n\r", ch);
			return;
		}

		if (!IS_SET_OLD(obj->value[1], CONT_CLOSED))
		{
			send_to_char("It's not closed.\n\r", ch);
			return;
		}

		if (obj->value[2] < 0)
		{
			send_to_char("It can't be unlocked.\n\r", ch);
			return;
		}

		if (!IS_SET_OLD(obj->value[1], CONT_LOCKED))
		{
			send_to_char("It's already unlocked.\n\r", ch);
			return;
		}

		if (IS_SET_OLD(obj->value[1], CONT_PICKPROOF))
		{
			send_to_char("You failed.\n\r", ch);
			return;
		}

		REMOVE_BIT_OLD(obj->value[1], CONT_LOCKED);

		act("You pick the lock on $p.", ch, obj, nullptr, TO_CHAR);
		act("$n picks the lock on $p.", ch, obj, nullptr, TO_ROOM);
		check_improve(ch, gsn_pick_lock, true, 2);
		return;
	}

	auto door = find_door(ch, arg);
	if (door < 0)
		return;

	/* 'pick door' */
	auto pexit = ch->in_room->exit[door];
	if (!IS_SET(pexit->exit_info, EX_CLOSED) && !is_immortal(ch))
	{
		send_to_char("It's not closed.\n\r", ch);
		return;
	}

	if (pexit->key < 0 && !is_immortal(ch))
	{
		send_to_char("It can't be picked.\n\r", ch);
		return;
	}

	if (!IS_SET(pexit->exit_info, EX_LOCKED))
	{
		send_to_char("It's already unlocked.\n\r", ch);
		return;
	}

	if (IS_SET(pexit->exit_info, EX_PICKPROOF) && !is_immortal(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	REMOVE_BIT(pexit->exit_info, EX_LOCKED);

	send_to_char("*Click*\n\r", ch);
	act("$n picks the $T.", ch, nullptr, pexit->keyword, TO_ROOM);
	check_improve(ch, gsn_pick_lock, true, 2);

	/* pick the other side */
	auto to_room = pexit->u1.to_room;
	auto pexit_rev = to_room->exit[rev_dir[door]];
	if (to_room != nullptr && pexit_rev != nullptr && pexit_rev->u1.to_room == ch->in_room)
	{
		REMOVE_BIT(pexit_rev->exit_info, EX_LOCKED);
	}
}